

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPluginAPI.cxx
# Opt level: O2

void __thiscall
cmCPluginAPISourceFileMap::~cmCPluginAPISourceFileMap(cmCPluginAPISourceFileMap *this)

{
  cmCPluginAPISourceFile *this_00;
  _Base_ptr p_Var1;
  
  for (p_Var1 = (this->
                super_map<cmSourceFile_*,_cmCPluginAPISourceFile_*,_std::less<cmSourceFile_*>,_std::allocator<std::pair<cmSourceFile_*const,_cmCPluginAPISourceFile_*>_>_>
                )._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 !=
      &(this->
       super_map<cmSourceFile_*,_cmCPluginAPISourceFile_*,_std::less<cmSourceFile_*>,_std::allocator<std::pair<cmSourceFile_*const,_cmCPluginAPISourceFile_*>_>_>
       )._M_t._M_impl.super__Rb_tree_header; p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1)) {
    this_00 = (cmCPluginAPISourceFile *)p_Var1[1]._M_parent;
    if (this_00 != (cmCPluginAPISourceFile *)0x0) {
      cmCPluginAPISourceFile::~cmCPluginAPISourceFile(this_00);
    }
    operator_delete(this_00,0xb0);
  }
  std::
  _Rb_tree<cmSourceFile_*,_std::pair<cmSourceFile_*const,_cmCPluginAPISourceFile_*>,_std::_Select1st<std::pair<cmSourceFile_*const,_cmCPluginAPISourceFile_*>_>,_std::less<cmSourceFile_*>,_std::allocator<std::pair<cmSourceFile_*const,_cmCPluginAPISourceFile_*>_>_>
  ::~_Rb_tree((_Rb_tree<cmSourceFile_*,_std::pair<cmSourceFile_*const,_cmCPluginAPISourceFile_*>,_std::_Select1st<std::pair<cmSourceFile_*const,_cmCPluginAPISourceFile_*>_>,_std::less<cmSourceFile_*>,_std::allocator<std::pair<cmSourceFile_*const,_cmCPluginAPISourceFile_*>_>_>
               *)this);
  return;
}

Assistant:

~cmCPluginAPISourceFileMap()
  {
    for (iterator i = this->begin(); i != this->end(); ++i) {
      delete i->second;
    }
  }